

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O0

PSocketAddress * p_socket_address_new_any(PSocketFamily family,puint16 port)

{
  undefined8 local_34;
  in6_addr any6_addr;
  puchar any_addr [4];
  PSocketAddress *ret;
  puint16 port_local;
  PSocketAddress *pPStack_10;
  PSocketFamily family_local;
  
  memset((void *)((long)&any6_addr.__in6_u + 8),0,4);
  memset(&local_34,0,0x10);
  register0x00000000 = (PSocketAddress *)p_malloc0(0x20);
  if (register0x00000000 == (PSocketAddress *)0x0) {
    printf("** Error: %s **\n","PSocketAddress::p_socket_address_new_any: failed to allocate memory"
          );
    pPStack_10 = (PSocketAddress *)0x0;
  }
  else {
    if (family == P_SOCKET_FAMILY_INET) {
      (register0x00000000->addr).sin_addr.s_addr = any6_addr.__in6_u.__u6_addr32[2];
    }
    else {
      if (family != P_SOCKET_FAMILY_INET6) {
        p_free(register0x00000000);
        return (PSocketAddress *)0x0;
      }
      *(undefined8 *)&register0x00000000->addr = local_34;
      *(undefined8 *)((long)&register0x00000000->addr + 8) = any6_addr.__in6_u._0_8_;
    }
    register0x00000000->family = family;
    register0x00000000->port = port;
    pPStack_10 = register0x00000000;
  }
  return pPStack_10;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_address_new_any (PSocketFamily	family,
			  puint16	port)
{
	PSocketAddress	*ret;
	puchar		any_addr[] = {0, 0, 0, 0};
#ifdef AF_INET6
	struct in6_addr	any6_addr = IN6ADDR_ANY_INIT;
#endif

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocketAddress))) == NULL)) {
		P_ERROR ("PSocketAddress::p_socket_address_new_any: failed to allocate memory");
		return NULL;
	}

	if (family == P_SOCKET_FAMILY_INET)
		memcpy (&ret->addr.sin_addr, any_addr, sizeof (any_addr));
#ifdef AF_INET6
	else if (family == P_SOCKET_FAMILY_INET6)
		memcpy (&ret->addr.sin6_addr, &any6_addr.s6_addr, sizeof (any6_addr.s6_addr));
#endif
	else {
		p_free (ret);
		return NULL;
	}

	ret->family = family;
	ret->port   = port;

	return ret;
}